

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O1

int __thiscall OpenMD::StuntDouble::freeze(StuntDouble *this)

{
  DataStoragePointer DVar1;
  Snapshot *pSVar2;
  int iVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  
  DVar1 = this->storage_;
  pSVar2 = this->snapshotMan_->currentSnapshot_;
  lVar5 = (long)this->localIndex_ * 0x18;
  puVar4 = (undefined8 *)
           (*(long *)((long)&(pSVar2->atomData).velocity.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar1) + lVar5);
  if (puVar4 != &OpenMD::V3Zero) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar4 + lVar6) = *(undefined8 *)((long)&OpenMD::V3Zero + lVar6);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x18);
  }
  puVar4 = (undefined8 *)
           (*(long *)((long)&(pSVar2->atomData).force.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + DVar1) + lVar5);
  if (puVar4 != &OpenMD::V3Zero) {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)puVar4 + lVar6) = *(undefined8 *)((long)&OpenMD::V3Zero + lVar6);
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0x18);
  }
  iVar3 = 3;
  if (this->objType_ - otDAtom < 2) {
    puVar4 = (undefined8 *)
             (*(long *)((long)&(pSVar2->atomData).angularMomentum.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + DVar1) + lVar5);
    if (puVar4 != &OpenMD::V3Zero) {
      lVar6 = 0;
      do {
        *(undefined8 *)((long)puVar4 + lVar6) = *(undefined8 *)((long)&OpenMD::V3Zero + lVar6);
        lVar6 = lVar6 + 8;
      } while (lVar6 != 0x18);
    }
    puVar4 = (undefined8 *)
             (lVar5 + *(long *)((long)&(pSVar2->atomData).torque.
                                       super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + DVar1));
    if (puVar4 != &OpenMD::V3Zero) {
      lVar5 = 0;
      do {
        *(undefined8 *)((long)puVar4 + lVar5) = *(undefined8 *)((long)&OpenMD::V3Zero + lVar5);
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x18);
    }
    iVar3 = 6 - (uint)this->linear_;
  }
  return iVar3;
}

Assistant:

void setVel(const Vector3d& vel) {
      ((snapshotMan_->getCurrentSnapshot())->*storage_).velocity[localIndex_] =
          vel;
    }